

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyReadLoadUnit(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  double dVar4;
  char *pSecond;
  float First;
  char *pHead;
  Scl_Item_t *pItem;
  Vec_Str_t *vOut_local;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  pHead = (char *)Scl_LibertyItem(p,pSVar2->Child);
  do {
    if (pHead == (char *)0x0) {
LAB_004a960f:
      printf(
            "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf).\n"
            );
      Vec_StrPutF_(vOut,1.0);
      Vec_StrPutI_(vOut,0xc);
      return;
    }
    iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pHead + 8),"capacitive_load_unit");
    if (iVar1 == 0) {
      pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pHead + 0x10));
      pcVar3 = strtok(pcVar3," \t\n\r\\\",");
      dVar4 = atof(pcVar3);
      pcVar3 = strtok((char *)0x0," \t\n\r\\\",");
      Vec_StrPutF_(vOut,(float)dVar4);
      if ((pcVar3 != (char *)0x0) && (iVar1 = strcmp(pcVar3,"pf"), iVar1 == 0)) {
        Vec_StrPutI_(vOut,0xc);
        return;
      }
      if ((pcVar3 != (char *)0x0) && (iVar1 = strcmp(pcVar3,"ff"), iVar1 == 0)) {
        Vec_StrPutI_(vOut,0xf);
        return;
      }
      goto LAB_004a960f;
    }
    pHead = (char *)Scl_LibertyItem(p,*(int *)(pHead + 0x20));
  } while( true );
}

Assistant:

void Scl_LibertyReadLoadUnit( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "capacitive_load_unit" )
    {
        // expecting (1.00,ff) or (1, pf) ... 12 or 15 for 'pf' or 'ff'
        char * pHead   = Scl_LibertyReadString(p, pItem->Head);
        float First    = atof(strtok(pHead, " \t\n\r\\\","));
        char * pSecond = strtok(NULL, " \t\n\r\\\",");
        Vec_StrPutF_( vOut, First );
        if ( pSecond && !strcmp(pSecond, "pf") )
            Vec_StrPutI_( vOut, 12 );
        else if ( pSecond && !strcmp(pSecond, "ff") )
            Vec_StrPutI_( vOut, 15 );
        else break;
        return;
    }
    printf( "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf).\n" );
    Vec_StrPutF_( vOut, 1.0 );
    Vec_StrPutI_( vOut, 12 );
}